

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayStack.hpp
# Opt level: O3

bool __thiscall
cplus::utils::ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push
          (ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *this,TreeNode **value)

{
  TreeNode ***value_00;
  TreeNode **ppTVar1;
  bool bVar2;
  TreeNode **ppTVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = this->endPoint;
  if (uVar4 == this->blockSize) {
    value_00 = &this->last;
    ppTVar1 = this->last;
    if (this->lastState != (TreeNode **)0x0) {
      operator_delete(this->lastState);
      this->lastState = (TreeNode **)0x0;
      uVar4 = this->blockSize;
    }
    ppTVar3 = (TreeNode **)operator_new__((ulong)uVar4 << 3);
    this->last = ppTVar3;
    bVar2 = Stack<cplus::utils::Set<cplus::lang::String>::TreeNode_**>::push
                      (&this->blockArrayStack,value_00);
    uVar4 = 0;
    if (!bVar2) {
      operator_delete(*value_00);
      *value_00 = ppTVar1;
      return false;
    }
  }
  this->endPoint = uVar4 + 1;
  ppTVar1 = this->last;
  lVar5 = 0;
  do {
    *(undefined1 *)((long)ppTVar1 + lVar5 + (ulong)uVar4 * 8) = *(undefined1 *)((long)value + lVar5)
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  return true;
}

Assistant:

bool push(const T &value) {
//				std::cout << "ArrayStack: bool push(const K &key): endpoint:" << endPoint << std::endl;
				//检查是否已到数据块边界
				if (endPoint == blockSize) {
					//保存last状态
					auto lastSave = last;
					//释放内存
					if (lastState != nullptr) {
						delete lastState;
						lastState = nullptr;
					}
					//分配内存
					last = new T[blockSize];
					//压入数据块栈
					if (!blockArrayStack.push(last)) {
						//如果失败
						//释放内存
						delete last;
						//还原last状态
						last = lastSave;
						//返回false表示失败
						return false;
					} else {
						//如果成功
						//更新endPoint指针状态
						endPoint = 0;
					}
				}
				//压数据入栈
				::cplus::memory::copy(value, last[endPoint++]);
				//返回true表示成功
				return true;
			}